

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.c
# Opt level: O1

void render_task(parallel_task_2d *task,size_t thread_id)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int i;
  int iVar8;
  int m;
  int iVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  iVar8 = (int)task->range[1].begin;
  iVar1 = (int)task->range[1].end;
  if (iVar8 < iVar1) {
    iVar2 = (int)task->range[0].begin;
    iVar3 = (int)task->range[0].end;
    pdVar4 = (double *)task[1].work_item.work_fn;
    do {
      if (iVar2 < iVar3) {
        iVar9 = iVar2;
        do {
          uVar5 = *(uint *)(pdVar4 + 4);
          if ((int)uVar5 < 1) {
            uVar7 = 1;
          }
          else {
            dVar11 = (pdVar4[3] * (double)(iVar8 + -1) +
                     (double)(*(int *)(pdVar4 + 5) - iVar8) * pdVar4[2]) /
                     (double)(*(int *)(pdVar4 + 5) + -1);
            dVar12 = ((double)(iVar9 + -1) * pdVar4[1] +
                     (double)(*(int *)((long)pdVar4 + 0x24) - iVar9) * *pdVar4) /
                     (double)(*(int *)((long)pdVar4 + 0x24) + -1);
            dVar13 = dVar11;
            dVar14 = dVar12;
            uVar6 = 1;
            do {
              dVar15 = (dVar14 * dVar14 - dVar13 * dVar13) + dVar12;
              uVar7 = uVar6;
              if ((2.0 < ABS(dVar15)) ||
                 (dVar13 = dVar13 * (dVar14 + dVar14) + dVar11, 2.0 < ABS(dVar13))) break;
              bVar10 = uVar6 != uVar5;
              dVar14 = dVar15;
              uVar6 = uVar6 + 1;
              uVar7 = uVar5 + 1;
            } while (bVar10);
          }
          if ((uVar7 & 1) == 0) {
            dVar13 = pow((double)(int)uVar7 / (double)(int)uVar5,0.125);
            uVar7 = (int)(dVar13 * 255.0) & 0xff;
            uVar5 = uVar7 * 0x999c >> 0x10;
            uVar7 = uVar7 << 0x10;
          }
          else {
            uVar7 = 0xff0000;
            uVar5 = 0xff;
          }
          *(uint *)((long)pdVar4[6] + (long)(*(int *)((long)pdVar4 + 0x24) * iVar8 + iVar9) * 4) =
               uVar5 << 8 | uVar7 | uVar5;
          iVar9 = iVar9 + 1;
        } while (iVar9 != iVar3);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar1);
  }
  return;
}

Assistant:

static void render_task(struct parallel_task_2d* task, size_t thread_id) {
    IGNORE(thread_id);
    struct render_task* render_task = (void*)task;
    struct tile tile = {
        .i = render_task->task.range[1].begin,
        .j = render_task->task.range[0].begin,
        .m = render_task->task.range[1].end,
        .n = render_task->task.range[0].end
    };
    render_tile(&tile, render_task->global_data);
}